

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

int64_t duckdb::Interval::GetMicro(interval_t *val)

{
  int64_t left;
  bool bVar1;
  ConversionException *pCVar2;
  allocator local_51;
  int64_t micro_total;
  string local_48;
  int64_t micro_day;
  int64_t micro_month;
  
  left = val->micros;
  micro_total = left;
  bVar1 = TryMultiplyOperator::Operation<long,long,long>
                    ((long)val->months,0x25b7f3d4000,&micro_month);
  if (!bVar1) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"Could not convert Month to Microseconds",&local_51);
    ConversionException::ConversionException(pCVar2,&local_48);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryMultiplyOperator::Operation<long,long,long>((long)val->days,86400000000,&micro_day);
  if (!bVar1) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"Could not convert Day to Microseconds",&local_51);
    ConversionException::ConversionException(pCVar2,&local_48);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryAddOperator::Operation<long,long,long>(left,micro_month,&micro_total);
  if (!bVar1) {
    pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_48,"Could not convert Interval to Microseconds",&local_51);
    ConversionException::ConversionException(pCVar2,&local_48);
    __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar1 = TryAddOperator::Operation<long,long,long>(micro_total,micro_day,&micro_total);
  if (bVar1) {
    return micro_total;
  }
  pCVar2 = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Could not convert Interval to Microseconds",&local_51);
  ConversionException::ConversionException(pCVar2,&local_48);
  __cxa_throw(pCVar2,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Interval::GetMicro(const interval_t &val) {
	int64_t micro_month, micro_day, micro_total;
	micro_total = val.micros;
	if (!TryMultiplyOperator::Operation((int64_t)val.months, MICROS_PER_MONTH, micro_month)) {
		throw ConversionException("Could not convert Month to Microseconds");
	}
	if (!TryMultiplyOperator::Operation((int64_t)val.days, MICROS_PER_DAY, micro_day)) {
		throw ConversionException("Could not convert Day to Microseconds");
	}
	if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(micro_total, micro_month, micro_total)) {
		throw ConversionException("Could not convert Interval to Microseconds");
	}
	if (!TryAddOperator::Operation<int64_t, int64_t, int64_t>(micro_total, micro_day, micro_total)) {
		throw ConversionException("Could not convert Interval to Microseconds");
	}

	return micro_total;
}